

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O0

void test46(char *infile,char *password,char *outfile,char *xarg)

{
  int iVar1;
  FILE *__stream;
  FILE *f;
  char *xarg_local;
  char *outfile_local;
  char *password_local;
  char *infile_local;
  
  __stream = (FILE *)safe_fopen(outfile,"wb");
  iVar1 = qpdf_read(qpdf,infile,password);
  if (iVar1 == 0) {
    qpdf_write_json(qpdf,2,write_to_file,__stream,0,1,"",0);
    fclose(__stream);
    report_errors();
    return;
  }
  __assert_fail("qpdf_read(qpdf, infile, password) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/qpdf-ctest.c"
                ,0x51a,"void test46(const char *, const char *, const char *, const char *)");
}

Assistant:

static void
test46(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    FILE* f = safe_fopen(outfile, "wb");
    assert(qpdf_read(qpdf, infile, password) == 0);
    qpdf_write_json(qpdf, 2, write_to_file, f, qpdf_dl_none, qpdf_sj_inline, "", NULL);
    fclose(f);
    report_errors();
}